

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::destroyAll(DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
             *this)

{
  bool bVar1;
  uint uVar2;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar3;
  Abbrev *pAVar4;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *E;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *P;
  undefined1 local_50 [8];
  Abbrev TombstoneKey;
  Abbrev EmptyKey;
  DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
  *this_local;
  
  uVar2 = getNumBuckets(this);
  if (uVar2 != 0) {
    getEmptyKey();
    getTombstoneKey();
    E = getBuckets(this);
    pDVar3 = getBucketsEnd(this);
    for (; E != pDVar3; E = E + 1) {
      pAVar4 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst(E);
      bVar1 = DWARFDebugNames::AbbrevMapInfo::isEqual
                        (pAVar4,(Abbrev *)
                                &TombstoneKey.Attributes.
                                 super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) {
        pAVar4 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst(E);
        bVar1 = DWARFDebugNames::AbbrevMapInfo::isEqual(pAVar4,(Abbrev *)local_50);
        if (!bVar1) {
          detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getSecond(E);
        }
      }
      pAVar4 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst(E);
      DWARFDebugNames::Abbrev::~Abbrev(pAVar4);
    }
    DWARFDebugNames::Abbrev::~Abbrev((Abbrev *)local_50);
    DWARFDebugNames::Abbrev::~Abbrev
              ((Abbrev *)
               &TombstoneKey.Attributes.
                super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void destroyAll() {
    if (getNumBuckets() == 0) // Nothing to do.
      return;

    const KeyT EmptyKey = getEmptyKey(), TombstoneKey = getTombstoneKey();
    for (BucketT *P = getBuckets(), *E = getBucketsEnd(); P != E; ++P) {
      if (!KeyInfoT::isEqual(P->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(P->getFirst(), TombstoneKey))
        P->getSecond().~ValueT();
      P->getFirst().~KeyT();
    }
  }